

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O1

void log_summary(bool ondemand)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  pid_t pVar3;
  bool bVar4;
  FILE *__stream;
  iterator iVar5;
  mapped_type *__dest;
  _Base_ptr p_Var6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  reverse_iterator it;
  long lVar9;
  long lVar10;
  multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_> allocations_by_size;
  map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
  allocations_by_callstack;
  _Rb_tree<hu_allocinfo_s,_hu_allocinfo_s,_std::_Identity<hu_allocinfo_s>,_size_compare,_std::allocator<hu_allocinfo_s>_>
  local_98;
  _Rb_tree<std::vector<void_*,_std::allocator<void_*>_>,_std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>,_std::_Select1st<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
  local_60;
  
  if (hu_log_file == (char *)0x0) {
    __stream = (FILE *)0x0;
  }
  else {
    __stream = fopen(hu_log_file,"a");
  }
  if (__stream != (FILE *)0x0) {
    p_Var2 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lVar9 = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var6 = (allocations->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar10 = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    if ((_Rb_tree_header *)p_Var6 != &(allocations->_M_t)._M_impl.super__Rb_tree_header) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        local_98._M_impl._0_8_ = (void *)0x0;
        local_98._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        std::vector<void*,std::allocator<void*>>::_M_assign_aux<void**>
                  ((vector<void*,std::allocator<void*>> *)&local_98,&p_Var6[1]._M_right,
                   &p_Var6[1]._M_right + *(int *)&p_Var6[6]._M_right);
        iVar5 = std::
                _Rb_tree<std::vector<void_*,_std::allocator<void_*>_>,_std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>,_std::_Select1st<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                ::find(&local_60,(key_type *)&local_98);
        if ((_Rb_tree_header *)iVar5._M_node == p_Var2) {
          __dest = std::
                   map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                   ::operator[]((map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                                 *)&local_60,(key_type *)&local_98);
          memcpy(__dest,&p_Var6[1]._M_parent,0x160);
        }
        else {
          piVar1 = (int *)((long)&iVar5._M_node[0xc]._M_left + 4);
          *piVar1 = *piVar1 + 1;
          *(long *)(iVar5._M_node + 2) =
               (long)&(p_Var6[1]._M_left)->_M_color + *(long *)(iVar5._M_node + 2);
        }
        lVar9 = (long)&(p_Var6[1]._M_left)->_M_color + lVar9;
        if ((void *)local_98._M_impl._0_8_ != (void *)0x0) {
          operator_delete((void *)local_98._M_impl._0_8_);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        lVar10 = lVar10 + 1;
      } while ((_Rb_tree_header *)p_Var6 != &(allocations->_M_t)._M_impl.super__Rb_tree_header);
    }
    p_Var8 = &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_98._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left = p_Var8;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right = p_Var8;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        std::
        _Rb_tree<hu_allocinfo_s,hu_allocinfo_s,std::_Identity<hu_allocinfo_s>,size_compare,std::allocator<hu_allocinfo_s>>
        ::_M_insert_equal<hu_allocinfo_s_const&>
                  ((_Rb_tree<hu_allocinfo_s,hu_allocinfo_s,std::_Identity<hu_allocinfo_s>,size_compare,std::allocator<hu_allocinfo_s>>
                    *)&local_98,(hu_allocinfo_s *)&p_Var6[1]._M_right);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var2);
    }
    if (ondemand) {
      fprintf(__stream,"==%d== ON DEMAND REPORT\n",(ulong)(uint)pid);
    }
    fprintf(__stream,"==%d== HEAP SUMMARY:\n",(ulong)(uint)pid);
    fprintf(__stream,"==%d==     in use at exit: %llu bytes in %llu blocks\n",(ulong)(uint)pid,lVar9
            ,lVar10);
    fprintf(__stream,"==%d==   total heap usage: %llu allocs, %llu frees, %llu bytes allocated\n",
            (ulong)(uint)pid,allocinfo_total_allocs,allocinfo_total_frees,
            allocinfo_total_alloc_bytes);
    fprintf(__stream,"==%d==    peak heap usage: %llu bytes allocated\n",(ulong)(uint)pid,
            allocinfo_peak_alloc_bytes);
    fprintf(__stream,"==%d== \n",(ulong)(uint)pid);
    if ((hu_leak == true) && (p_Var8 != local_98._M_impl.super__Rb_tree_header._M_header._M_left)) {
      do {
        lVar7 = std::_Rb_tree_decrement(p_Var8);
        if (*(ulong *)(lVar7 + 0x28) < hu_log_minleak) break;
        bVar4 = log_is_valid_callstack(*(int *)(lVar7 + 0xd0),(void **)(lVar7 + 0x30),true);
        pVar3 = pid;
        if (bVar4) {
          lVar7 = std::_Rb_tree_decrement(p_Var8);
          fprintf(__stream,"==%d== %zu bytes in %d block(s) are lost, originally allocated at:\n",
                  (ulong)(uint)pVar3,*(undefined8 *)(lVar7 + 0x28),(ulong)*(uint *)(lVar7 + 0x17c));
          lVar7 = std::_Rb_tree_decrement(p_Var8);
          log_print_callstack((FILE *)__stream,*(int *)(lVar7 + 0xd0),(void **)(lVar7 + 0x30));
          fprintf(__stream,"==%d== \n",(ulong)(uint)pid);
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var8);
      } while (p_Var8 != local_98._M_impl.super__Rb_tree_header._M_header._M_left);
    }
    fprintf(__stream,"==%d== LEAK SUMMARY:\n",(ulong)(uint)pid);
    fprintf(__stream,"==%d==    definitely lost: %llu bytes in %llu blocks\n",(ulong)(uint)pid,lVar9
            ,lVar10);
    fprintf(__stream,"==%d== \n",(ulong)(uint)pid);
    fclose(__stream);
    std::
    _Rb_tree<hu_allocinfo_s,_hu_allocinfo_s,_std::_Identity<hu_allocinfo_s>,_size_compare,_std::allocator<hu_allocinfo_s>_>
    ::~_Rb_tree(&local_98);
    std::
    _Rb_tree<std::vector<void_*,_std::allocator<void_*>_>,_std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>,_std::_Select1st<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void log_summary(bool ondemand)
{
  FILE *f = NULL;
  if (hu_log_file)
  {
    f = fopen(hu_log_file, "a");
  }

  if (!f)
  {
    return;
  }

  unsigned long long leak_total_bytes = 0;
  unsigned long long leak_total_blocks = 0;

  /* Group results by callstack */
  std::map<std::vector<void*>, hu_allocinfo_t> allocations_by_callstack;
  for (auto it = allocations->begin(); it != allocations->end(); ++it)
  {
    std::vector<void*> callstack;
    callstack.assign(it->second.callstack, it->second.callstack + it->second.callstack_depth);

    auto callstack_it = allocations_by_callstack.find(callstack);
    if (callstack_it != allocations_by_callstack.end())
    {
      callstack_it->second.count += 1;
      callstack_it->second.size += it->second.size;
    }
    else
    {
      allocations_by_callstack[callstack] = it->second;
    }

    leak_total_bytes += it->second.size;
    leak_total_blocks += 1;
  }

  /* Sort results by total allocation size */
  std::multiset<hu_allocinfo_t, size_compare> allocations_by_size;
  for (auto it = allocations_by_callstack.begin(); it != allocations_by_callstack.end(); ++it)
  {
      allocations_by_size.insert(it->second);
  }

  /* Indicate in case an on-demand report */
  if (ondemand)
  {
    fprintf(f, "==%d== ON DEMAND REPORT\n", pid);
  }

  /* Output heap summary */
  fprintf(f, "==%d== HEAP SUMMARY:\n", pid);
  fprintf(f, "==%d==     in use at exit: %llu bytes in %llu blocks\n",
          pid, leak_total_bytes, leak_total_blocks);
  fprintf(f, "==%d==   total heap usage: %llu allocs, %llu frees, %llu bytes allocated\n",
          pid, allocinfo_total_allocs, allocinfo_total_frees, allocinfo_total_alloc_bytes);
  fprintf(f, "==%d==    peak heap usage: %llu bytes allocated\n",
          pid, allocinfo_peak_alloc_bytes);
  fprintf(f, "==%d== \n", pid);

  /* Output leak details */
  if (hu_leak)
  {
    for (auto it = allocations_by_size.rbegin(); (it != allocations_by_size.rend()) && (it->size >= hu_log_minleak); ++it)
    {
      if (log_is_valid_callstack(it->callstack_depth, it->callstack, true))
      {
        fprintf(f, "==%d== %zu bytes in %d block(s) are lost, originally allocated at:\n", pid, it->size, it->count);

        log_print_callstack(f, it->callstack_depth, it->callstack);
    
        fprintf(f, "==%d== \n", pid);
      }
    }
  }
  
  /* Output leak summary */
  fprintf(f, "==%d== LEAK SUMMARY:\n", pid);
  fprintf(f, "==%d==    definitely lost: %llu bytes in %llu blocks\n", pid,
         leak_total_bytes, leak_total_blocks);
  fprintf(f, "==%d== \n", pid);

  fclose(f);
}